

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<unsigned_int> *values)

{
  uint *value_00;
  bool bVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  int iVar3;
  uint value;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)((long)&local_38 + 4));
  if (bVar1) {
    value_00 = (uint *)((long)&local_38 + 4);
    RepeatedField<unsigned_int>::Add(values,value_00);
    local_38 = CONCAT44(local_38._4_4_,tag) & 0xffffffff000000ff | 0x80;
    for (iVar3 = values->total_size_ - values->current_size_; bVar1 = true, 0 < iVar3;
        iVar3 = iVar3 + -1) {
      if (tag < 0x80) {
        pbVar2 = input->buffer_;
        if (input->buffer_end_ <= pbVar2) {
          return true;
        }
        if (*pbVar2 != tag) {
          return true;
        }
        pbVar2 = pbVar2 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pbVar2 < 2) {
          return true;
        }
        if ((uint)local_38 != *pbVar2) {
          return true;
        }
        if (tag >> 7 != (uint)pbVar2[1]) {
          return true;
        }
        pbVar2 = pbVar2 + 2;
      }
      input->buffer_ = pbVar2;
      bVar1 = io::CodedInputStream::ReadVarint32(input,value_00);
      if (!bVar1) goto LAB_004b781f;
      RepeatedField<unsigned_int>::AddAlreadyReserved(values,value_00);
    }
  }
  else {
LAB_004b781f:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}